

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O1

void __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::~Graph(Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
         *this)

{
  Vertex *this_00;
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->vertex_map_)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this_00 = (Vertex *)p_Var1[2]._M_nxt;
    if (this_00 != (Vertex *)0x0) {
      Vertex::~Vertex(this_00);
      operator_delete(this_00);
    }
  }
  std::
  _Hashtable<long,_std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->vertex_map_)._M_h);
  return;
}

Assistant:

Graph<State, Transition, StateIndexer>::~Graph() {
  for (auto &vertex_pair : vertex_map_) {
    delete vertex_pair.second;
  }
}